

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall
Lodtalk::AST::PragmaDefinition::PragmaDefinition
          (PragmaDefinition *this,VMContext *context,string *selector)

{
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__PragmaDefinition_001702c8;
  this->context = context;
  std::__cxx11::string::string((string *)&this->selector,(string *)selector);
  (this->parameters).super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameters).super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

PragmaDefinition::PragmaDefinition(VMContext *context, const std::string &selector)
    : context(context), selector(selector)
{
}